

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O3

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0>::generateCLI
          (NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0> *this)

{
  App *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  string_view localAddress;
  shared_ptr<helics::helicsCLI11App> sVar2;
  App_p local_38;
  _Alloc_hider local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  BrokerBase::generateCLI((BrokerBase *)this);
  localAddress._M_str = (char *)0x9;
  localAddress._M_len = in_RSI + 0xdc0;
  NetworkBrokerData::commandLineParser
            ((NetworkBrokerData *)&stack0xffffffffffffffd8,localAddress,true);
  this_00 = (App *)(this->super_CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore>).
                   super_CommonCore.super_Core._vptr_Core;
  local_38.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28._M_p;
  local_38.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_20;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  CLI::App::add_subcommand(this_00,&local_38);
  _Var1._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkCore<COMMS, baseline>::generateCLI()
{
    auto app = CommonCore::generateCLI();
    CLI::App_p netApp =
        netInfo.commandLineParser(defLocalInterface[static_cast<int>(baseline)], false);
    app->add_subcommand(netApp);
    return app;
}